

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O3

void __thiscall polyscope::TransformationGizmo::draw(TransformationGizmo *this)

{
  float fVar1;
  float fVar2;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aVar3;
  mat4 *pmVar4;
  element_type *peVar5;
  float fVar6;
  float fVar7;
  uint *puVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar47;
  float fVar48;
  float fVar49;
  undefined1 auVar46 [16];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  vec4 vVar59;
  mat4 projMat;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  mat4 Pinv;
  mat4 P;
  uint local_3a0;
  uint local_39c;
  undefined8 local_398;
  undefined8 local_390;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 local_384;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_380;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_37c;
  undefined1 local_378 [16];
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  ulong local_130;
  ulong local_128;
  ulong local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  ulong local_100;
  ulong local_f8;
  undefined1 local_f0 [64];
  undefined1 local_b0 [64];
  mat<4,_4,_float,_(glm::qualifier)0> local_70;
  
  if ((this->enabled).value == true) {
    if ((this->ringProgram).
        super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      prepare(this);
    }
    pmVar4 = this->T;
    local_380 = pmVar4->value[0].field_0;
    local_384 = pmVar4->value[0].field_1;
    local_37c = pmVar4->value[0].field_2;
    local_378 = ZEXT416((uint)(this->gizmoSizeRel * state::lengthScale));
    view::getCameraViewMatrix();
    pmVar4 = this->T;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = local_128;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = local_118;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_108;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = local_f8;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = local_130;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = local_120;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = local_110;
    auVar10 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar4->value[2].field_1));
    auVar11 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar4->value[3].field_0));
    auVar12 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar4->value[3].field_1));
    auVar13 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar4->value[3].field_3));
    auVar27 = ZEXT416((uint)pmVar4->value[1].field_0);
    auVar28 = ZEXT416((uint)pmVar4->value[0].field_0);
    auVar26 = vinsertps_avx(auVar27,auVar28,0x10);
    auVar27 = vinsertps_avx(auVar28,auVar27,0x10);
    fVar6 = (float)local_128;
    auVar16._0_4_ = auVar26._0_4_ * fVar6;
    fVar7 = (float)(local_128 >> 0x20);
    auVar16._4_4_ = auVar26._4_4_ * fVar7;
    auVar16._8_4_ = auVar26._8_4_ * 0.0;
    auVar16._12_4_ = auVar26._12_4_ * 0.0;
    auVar14 = vmulps_avx512vl(auVar18,auVar10);
    auVar24 = ZEXT416((uint)pmVar4->value[1].field_1);
    auVar25 = ZEXT416((uint)pmVar4->value[0].field_1);
    auVar28 = vinsertps_avx(auVar24,auVar25,0x10);
    auVar15 = vmulps_avx512vl(auVar18,auVar28);
    auVar16 = vaddps_avx512vl(auVar16,auVar15);
    auVar24 = vinsertps_avx512f(auVar25,auVar24,0x10);
    auVar17 = vmulps_avx512vl(auVar18,auVar24);
    auVar18 = vmulps_avx512vl(auVar18,auVar12);
    auVar15 = ZEXT416((uint)pmVar4->value[1].field_2);
    auVar19 = ZEXT416((uint)pmVar4->value[0].field_2);
    auVar25 = vinsertps_avx512f(auVar15,auVar19,0x10);
    auVar15 = vinsertps_avx(auVar19,auVar15,0x10);
    auVar19 = vmulps_avx512vl(auVar46,auVar25);
    fVar47 = (float)(local_108 >> 0x20);
    auVar23._0_4_ = auVar16._0_4_ + auVar19._0_4_;
    auVar23._4_4_ = auVar16._4_4_ + auVar19._4_4_;
    auVar23._8_4_ = auVar16._8_4_ + auVar19._8_4_;
    auVar23._12_4_ = auVar16._12_4_ + auVar19._12_4_;
    auVar20._0_4_ = auVar27._0_4_ * fVar6 + auVar17._0_4_ + (float)local_108 * auVar15._0_4_;
    auVar20._4_4_ = auVar27._4_4_ * fVar7 + auVar17._4_4_ + fVar47 * auVar15._4_4_;
    auVar20._8_4_ = auVar27._8_4_ * 0.0 + auVar17._8_4_ + auVar15._8_4_ * 0.0;
    auVar20._12_4_ = auVar27._12_4_ * 0.0 + auVar17._12_4_ + auVar15._12_4_ * 0.0;
    auVar16 = ZEXT416((uint)pmVar4->value[0].field_3);
    auVar19 = ZEXT416((uint)pmVar4->value[1].field_3);
    auVar17 = vinsertps_avx512f(auVar19,auVar16,0x10);
    auVar16 = vinsertps_avx(auVar16,auVar19,0x10);
    fVar1 = pmVar4->value[2].field_0.x;
    auVar19 = vmulps_avx512vl(auVar51,auVar17);
    auVar19 = vaddps_avx512vl(auVar23,auVar19);
    fVar2 = pmVar4->value[3].field_2.z;
    auVar34._0_4_ = (float)local_f8 * auVar16._0_4_;
    auVar34._4_4_ = (float)(local_f8 >> 0x20) * auVar16._4_4_;
    auVar34._8_4_ = auVar16._8_4_ * 0.0;
    auVar34._12_4_ = auVar16._12_4_ * 0.0;
    auVar20 = vaddps_avx512vl(auVar20,auVar34);
    aVar3 = pmVar4->value[2].field_3;
    auVar33._4_4_ = aVar3;
    auVar33._0_4_ = aVar3;
    auVar33._8_4_ = aVar3;
    auVar33._12_4_ = aVar3;
    auVar35._0_4_ = fVar1 * fVar6;
    auVar35._4_4_ = fVar1 * fVar7;
    auVar35._8_4_ = fVar1 * 0.0;
    auVar35._12_4_ = fVar1 * 0.0;
    auVar21 = vmulps_avx512vl(auVar36,auVar11);
    auVar14 = vaddps_avx512vl(auVar35,auVar14);
    auVar22 = vbroadcastss_avx512vl(ZEXT416((uint)pmVar4->value[2].field_2));
    auVar37._0_4_ = auVar21._0_4_ + auVar18._0_4_ + (float)local_108 * fVar2;
    auVar37._4_4_ = auVar21._4_4_ + auVar18._4_4_ + fVar47 * fVar2;
    auVar37._8_4_ = auVar21._8_4_ + auVar18._8_4_ + fVar2 * 0.0;
    auVar37._12_4_ = auVar21._12_4_ + auVar18._12_4_ + fVar2 * 0.0;
    auVar18 = vmulps_avx512vl(auVar51,auVar13);
    auVar21 = vmulps_avx512vl(auVar51,auVar33);
    auVar18 = vaddps_avx512vl(auVar37,auVar18);
    fVar6 = (float)local_130;
    fVar7 = (float)(local_130 >> 0x20);
    auVar23 = vmulps_avx512vl(auVar46,auVar22);
    auVar24 = vmulps_avx512vl(auVar39,auVar24);
    auVar14 = vaddps_avx512vl(auVar14,auVar23);
    auVar25 = vmulps_avx512vl(auVar40,auVar25);
    auVar14 = vaddps_avx512vl(auVar14,auVar21);
    fVar47 = (float)(local_110 >> 0x20);
    auVar10 = vmulps_avx512vl(auVar39,auVar10);
    auVar12 = vmulps_avx512vl(auVar39,auVar12);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = local_100;
    auVar17 = vmulps_avx512vl(auVar58,auVar17);
    fVar41 = auVar17._0_4_ +
             auVar25._0_4_ + auVar28._0_4_ * (float)local_120 + auVar26._0_4_ * fVar6;
    fVar42 = auVar17._4_4_ +
             auVar25._4_4_ + auVar28._4_4_ * (float)(local_120 >> 0x20) + auVar26._4_4_ * fVar7;
    fVar43 = auVar17._8_4_ + auVar25._8_4_ + auVar28._8_4_ * 0.0 + auVar26._8_4_ * 0.0;
    fVar44 = auVar17._12_4_ + auVar25._12_4_ + auVar28._12_4_ * 0.0 + auVar26._12_4_ * 0.0;
    auVar26 = vmulps_avx512vl(auVar58,auVar16);
    fVar45 = auVar27._0_4_ * fVar6 + auVar24._0_4_ + auVar15._0_4_ * (float)local_110 +
             auVar26._0_4_;
    fVar48 = auVar27._4_4_ * fVar7 + auVar24._4_4_ + auVar15._4_4_ * fVar47 + auVar26._4_4_;
    fVar49 = auVar27._8_4_ * 0.0 + auVar24._8_4_ + auVar15._8_4_ * 0.0 + auVar26._8_4_;
    fVar50 = auVar27._12_4_ * 0.0 + auVar24._12_4_ + auVar15._12_4_ * 0.0 + auVar26._12_4_;
    auVar26 = vmulps_avx512vl(auVar38,auVar11);
    auVar27 = vmulps_avx512vl(auVar40,auVar22);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_100;
    auVar28 = vmulps_avx512vl(auVar15,auVar13);
    auVar15 = vmulps_avx512vl(auVar15,auVar33);
    auVar55._0_4_ = auVar26._0_4_ + auVar12._0_4_ + (float)local_110 * fVar2 + auVar28._0_4_;
    auVar55._4_4_ = auVar26._4_4_ + auVar12._4_4_ + fVar47 * fVar2 + auVar28._4_4_;
    auVar55._8_4_ = auVar26._8_4_ + auVar12._8_4_ + fVar2 * 0.0 + auVar28._8_4_;
    auVar55._12_4_ = auVar26._12_4_ + auVar12._12_4_ + fVar2 * 0.0 + auVar28._12_4_;
    auVar52._0_4_ = fVar1 * fVar6 + auVar10._0_4_ + auVar27._0_4_ + auVar15._0_4_;
    auVar52._4_4_ = fVar1 * fVar7 + auVar10._4_4_ + auVar27._4_4_ + auVar15._4_4_;
    auVar52._8_4_ = fVar1 * 0.0 + auVar10._8_4_ + auVar27._8_4_ + auVar15._8_4_;
    auVar52._12_4_ = fVar1 * 0.0 + auVar10._12_4_ + auVar27._12_4_ + auVar15._12_4_;
    fVar1 = (float)local_378._0_4_ * 0.0;
    auVar24._4_4_ = fVar1;
    auVar24._0_4_ = fVar1;
    auVar24._8_4_ = fVar1;
    auVar24._12_4_ = fVar1;
    auVar25._4_4_ = local_378._0_4_;
    auVar25._0_4_ = local_378._0_4_;
    auVar25._8_4_ = local_378._0_4_;
    auVar25._12_4_ = local_378._0_4_;
    auVar26 = vblendps_avx(auVar24,auVar25,2);
    auVar17._4_12_ = auVar24._4_12_;
    auVar17._0_4_ = local_378._0_4_;
    auVar27 = vblendps_avx(auVar25,auVar24,2);
    auVar28 = vmulps_avx512vl(auVar24,auVar52);
    auVar15 = vmulps_avx512vl(auVar24,auVar14);
    auVar16 = vmulps_avx512vl(auVar24,auVar55);
    auVar24 = vmulps_avx512vl(auVar24,auVar18);
    auVar11._4_12_ = auVar25._4_12_;
    auVar11._0_4_ = fVar1;
    auVar53._0_4_ = auVar26._0_4_ * fVar41;
    auVar53._4_4_ = auVar26._4_4_ * fVar42;
    auVar53._8_4_ = auVar26._8_4_ * fVar43;
    auVar53._12_4_ = auVar26._12_4_ * fVar44;
    auVar54._0_4_ = fVar45 * (float)local_378._0_4_;
    auVar54._4_4_ = fVar48 * fVar1;
    auVar54._8_4_ = fVar49 * fVar1;
    auVar54._12_4_ = fVar50 * fVar1;
    auVar13._0_4_ = auVar27._0_4_ * fVar41;
    auVar13._4_4_ = auVar27._4_4_ * fVar42;
    auVar13._8_4_ = auVar27._8_4_ * fVar43;
    auVar13._12_4_ = auVar27._12_4_ * fVar44;
    auVar21._0_4_ = fVar1 * fVar45;
    auVar21._4_4_ = (float)local_378._0_4_ * fVar48;
    auVar21._8_4_ = (float)local_378._0_4_ * fVar49;
    auVar21._12_4_ = (float)local_378._0_4_ * fVar50;
    auVar25 = vmulps_avx512vl(auVar26,auVar19);
    auVar17 = vmulps_avx512vl(auVar17,auVar20);
    auVar10 = vmulps_avx512vl(auVar27,auVar19);
    auVar11 = vmulps_avx512vl(auVar11,auVar20);
    auVar12 = vaddps_avx512vl(auVar13,auVar21);
    auVar26 = vblendps_avx(auVar21,auVar13,2);
    auVar27 = vblendps_avx(auVar53,auVar54,2);
    auVar56._0_4_ = auVar53._0_4_ + auVar54._0_4_;
    auVar56._4_4_ = auVar53._4_4_ + auVar54._4_4_;
    auVar56._8_4_ = auVar53._8_4_ + auVar54._8_4_;
    auVar56._12_4_ = auVar53._12_4_ + auVar54._12_4_;
    auVar57._0_4_ = auVar25._0_4_ + auVar17._0_4_;
    auVar57._4_4_ = auVar25._4_4_ + auVar17._4_4_;
    auVar57._8_4_ = auVar25._8_4_ + auVar17._8_4_;
    auVar57._12_4_ = auVar25._12_4_ + auVar17._12_4_;
    auVar13 = vaddps_avx512vl(auVar56,auVar28);
    auVar28 = vaddps_avx512vl(auVar12,auVar28);
    auVar12 = vaddps_avx512vl(auVar10,auVar11);
    auVar21 = vaddps_avx512vl(auVar57,auVar15);
    auVar22._0_4_ = auVar26._0_4_ + auVar27._0_4_ + auVar52._0_4_ * (float)local_378._0_4_;
    auVar22._4_4_ = auVar26._4_4_ + auVar27._4_4_ + auVar52._4_4_ * (float)local_378._0_4_;
    auVar22._8_4_ = auVar26._8_4_ + auVar27._8_4_ + auVar52._8_4_ * (float)local_378._0_4_;
    auVar22._12_4_ = auVar26._12_4_ + auVar27._12_4_ + auVar52._12_4_ * (float)local_378._0_4_;
    auVar26 = vblendps_avx(auVar11,auVar10,2);
    auVar27 = vblendps_avx(auVar25,auVar17,2);
    auVar25 = vaddps_avx512vl(auVar13,auVar16);
    auVar17 = vaddps_avx512vl(auVar21,auVar24);
    auVar15 = vaddps_avx512vl(auVar12,auVar15);
    auVar28 = vaddps_avx512vl(auVar28,auVar16);
    auVar16 = vaddps_avx512vl(auVar22,auVar16);
    auVar10._0_4_ = auVar26._0_4_ + auVar27._0_4_ + (float)local_378._0_4_ * auVar14._0_4_;
    auVar10._4_4_ = auVar26._4_4_ + auVar27._4_4_ + (float)local_378._0_4_ * auVar14._4_4_;
    auVar10._8_4_ = auVar26._8_4_ + auVar27._8_4_ + (float)local_378._0_4_ * auVar14._8_4_;
    auVar10._12_4_ = auVar26._12_4_ + auVar27._12_4_ + (float)local_378._0_4_ * auVar14._12_4_;
    auVar30 = vinsertf32x4_avx512f(ZEXT1664(auVar25),auVar17,1);
    auVar26 = vaddps_avx512vl(auVar15,auVar24);
    auVar27 = vaddps_avx512vl(auVar10,auVar24);
    auVar31 = vinsertf32x4_avx512f(ZEXT1664(auVar28),auVar26,1);
    auVar32 = vinsertf32x4_avx512f(ZEXT1664(auVar16),auVar27,1);
    auVar26 = vmulps_avx512vl(auVar20,ZEXT816(0) << 0x20);
    auVar29 = vpermi2pd_avx512vl(_DAT_00336d60,auVar30._0_32_,auVar31._0_32_);
    auVar27 = vmulps_avx512vl(auVar19,ZEXT816(0) << 0x20);
    auVar30 = vbroadcasti64x4_avx512f(_DAT_00336d40);
    auVar28._0_4_ = auVar27._0_4_ + auVar26._0_4_ + auVar14._0_4_ * 0.0;
    auVar28._4_4_ = auVar27._4_4_ + auVar26._4_4_ + auVar14._4_4_ * 0.0;
    auVar28._8_4_ = auVar27._8_4_ + auVar26._8_4_ + auVar14._8_4_ * 0.0;
    auVar28._12_4_ = auVar27._12_4_ + auVar26._12_4_ + auVar14._12_4_ * 0.0;
    auVar26 = vaddps_avx512vl(auVar28,auVar18);
    auVar31 = vinsertf32x4_avx512f
                        (ZEXT1664(CONCAT412(auVar55._12_4_ +
                                            fVar44 * 0.0 + fVar50 * 0.0 + auVar52._12_4_ * 0.0,
                                            CONCAT48(auVar55._8_4_ +
                                                     fVar43 * 0.0 + fVar49 * 0.0 +
                                                     auVar52._8_4_ * 0.0,
                                                     CONCAT44(auVar55._4_4_ +
                                                              fVar42 * 0.0 + fVar48 * 0.0 +
                                                              auVar52._4_4_ * 0.0,
                                                              auVar55._0_4_ +
                                                              fVar41 * 0.0 + fVar45 * 0.0 +
                                                              auVar52._0_4_ * 0.0)))),auVar26,1);
    auVar30 = vpermi2pd_avx512f(auVar30,auVar32,auVar31);
    local_f0 = vinsertf64x4_avx512f(auVar30,auVar29,0);
    peVar5 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"u_modelView","");
    (*peVar5->_vptr_ShaderProgram[7])(peVar5,(string *)local_150,local_f0);
    if (local_150[0] != local_140) {
      operator_delete(local_150[0]);
    }
    peVar5 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_170[0] = local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"u_modelView","");
    (*peVar5->_vptr_ShaderProgram[7])(peVar5,(string *)local_170,local_f0);
    if (local_170[0] != local_160) {
      operator_delete(local_170[0]);
    }
    peVar5 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"u_modelView","");
    (*peVar5->_vptr_ShaderProgram[7])(peVar5,(string *)local_190,local_f0);
    if (local_190[0] != local_180) {
      operator_delete(local_190[0]);
    }
    view::getCameraPerspectiveMatrix();
    peVar5 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1b0[0] = local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"u_projMatrix","");
    (*peVar5->_vptr_ShaderProgram[7])(peVar5,local_1b0,&local_130);
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0]);
    }
    peVar5 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1d0[0] = local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"u_projMatrix","");
    (*peVar5->_vptr_ShaderProgram[7])(peVar5,local_1d0,&local_130);
    if (local_1d0[0] != local_1c0) {
      operator_delete(local_1d0[0]);
    }
    peVar5 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_1f0[0] = local_1e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"u_projMatrix","");
    (*peVar5->_vptr_ShaderProgram[7])(peVar5,local_1f0,&local_130);
    if (local_1f0[0] != local_1e0) {
      operator_delete(local_1f0[0]);
    }
    peVar5 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_210[0] = local_200;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"u_diskWidthRel","");
    (*peVar5->_vptr_ShaderProgram[5])((ulong)(uint)this->diskWidthObj,peVar5,local_210);
    if (local_210[0] != local_200) {
      operator_delete(local_210[0]);
    }
    render::Engine::setMaterialUniforms
              (render::engine,
               (this->arrowProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&this->material);
    render::Engine::setMaterialUniforms
              (render::engine,
               (this->sphereProgram).
               super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&this->material);
    local_390 = 0;
    local_39c = 0;
    local_398 = 0;
    local_3a0 = 0;
    if (this->selectedType == Rotation) {
      if (this->selectedDim == 2) {
        puVar8 = &local_39c;
      }
      else if (this->selectedDim == 1) {
        puVar8 = (uint *)((long)&local_390 + 4);
      }
      else {
        puVar8 = (uint *)&local_390;
      }
      *puVar8 = 0x3f800000;
    }
    peVar5 = (this->ringProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_230[0] = local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"u_active","");
    (*peVar5->_vptr_ShaderProgram[9])(local_390,(ulong)local_39c,peVar5,local_230);
    if (local_230[0] != local_220) {
      operator_delete(local_230[0]);
    }
    if (this->selectedType == Translation) {
      if (this->selectedDim == 2) {
        puVar8 = &local_3a0;
      }
      else if (this->selectedDim == 1) {
        puVar8 = (uint *)((long)&local_398 + 4);
      }
      else {
        puVar8 = (uint *)&local_398;
      }
      *puVar8 = 0x3f800000;
    }
    peVar5 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_250[0] = local_240;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"u_active","");
    (*peVar5->_vptr_ShaderProgram[9])(local_398,(ulong)local_3a0,peVar5,local_250);
    if (local_250[0] != local_240) {
      operator_delete(local_250[0]);
    }
    bVar9 = this->selectedType == Scale;
    if (bVar9) {
      uStack_35c = 0x3f733333;
      local_368 = 0x3f733333;
      uStack_364 = 0x3f733333;
      uStack_360 = 0x3f733333;
    }
    else {
      uStack_35c = 0x3f59999a;
      local_368 = 0x3f59999a;
      uStack_364 = 0x3f59999a;
      uStack_360 = 0x3f59999a;
    }
    view::getCameraPerspectiveMatrix();
    glm::detail::compute_inverse<4,_4,_float,_(glm::qualifier)0,_false>::call(&local_70);
    peVar5 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_270[0] = local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"u_invProjMatrix","");
    (*peVar5->_vptr_ShaderProgram[7])(peVar5,local_270,local_b0);
    if (local_270[0] != local_260) {
      operator_delete(local_270[0]);
    }
    peVar5 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_290[0] = local_280;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"u_viewport","");
    vVar59 = render::Engine::getCurrentViewport(render::engine);
    (*peVar5->_vptr_ShaderProgram[10])(vVar59._0_8_,vVar59._8_8_,peVar5,local_290);
    if (local_290[0] != local_280) {
      operator_delete(local_290[0]);
    }
    peVar5 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_2b0[0] = local_2a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"u_lengthMult","");
    (*peVar5->_vptr_ShaderProgram[5])((ulong)(uint)this->vecLength,peVar5,local_2b0);
    if (local_2b0[0] != local_2a0) {
      operator_delete(local_2b0[0]);
    }
    peVar5 = (this->arrowProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_2d0[0] = local_2c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"u_radius","");
    auVar26 = ZEXT416((uint)(local_380.x * local_380.x + local_384.y * local_384.y +
                            local_37c.z * local_37c.z));
    auVar26 = vsqrtss_avx(auVar26,auVar26);
    fVar1 = auVar26._0_4_ * (float)local_378._0_4_;
    local_378._0_4_ = fVar1;
    (*peVar5->_vptr_ShaderProgram[6])((double)fVar1 * 0.2,peVar5,local_2d0);
    if (local_2d0[0] != local_2c0) {
      operator_delete(local_2d0[0]);
    }
    peVar5 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_2f0[0] = local_2e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"u_invProjMatrix","");
    (*peVar5->_vptr_ShaderProgram[7])(peVar5,local_2f0,local_b0);
    if (local_2f0[0] != local_2e0) {
      operator_delete(local_2f0[0]);
    }
    peVar5 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_310[0] = local_300;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"u_viewport","");
    vVar59 = render::Engine::getCurrentViewport(render::engine);
    (*peVar5->_vptr_ShaderProgram[10])(vVar59._0_8_,vVar59._8_8_,peVar5,local_310);
    if (local_310[0] != local_300) {
      operator_delete(local_310[0]);
    }
    peVar5 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_330[0] = local_320;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"u_pointRadius","");
    (*peVar5->_vptr_ShaderProgram[5])
              ((ulong)(uint)((float)local_378._0_4_ * this->sphereRad),peVar5,local_330);
    if (local_330[0] != local_320) {
      operator_delete(local_330[0]);
    }
    peVar5 = (this->sphereProgram).
             super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    local_350[0] = local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"u_baseColor","");
    (*peVar5->_vptr_ShaderProgram[9])
              (CONCAT44(uStack_364,local_368),
               (ulong)((uint)bVar9 * 0x3f733333 + (uint)!bVar9 * 0x3f59999a),peVar5,local_350);
    if (local_350[0] != local_340) {
      operator_delete(local_350[0]);
    }
    (*render::engine->_vptr_Engine[10])(render::engine,0);
    (*render::engine->_vptr_Engine[0xb])(render::engine,0);
    (*render::engine->_vptr_Engine[0xd])(render::engine,0);
    (*((this->ringProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x24])();
    (*((this->arrowProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x24])();
    (*((this->sphereProgram).
       super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_ShaderProgram[0x24])();
  }
  return;
}

Assistant:

void TransformationGizmo::draw() {
  if (!enabled.get()) return;
  if (!ringProgram) prepare();

  // == set uniforms

  float transScale = glm::length(glm::vec3(T[0]));
  float gizmoSizePreTrans = gizmoSizeRel * state::lengthScale;
  float gizmoSize = transScale * gizmoSizePreTrans;

  glm::mat4 viewMat =
      view::getCameraViewMatrix() * T * glm::scale(glm::vec3{gizmoSizePreTrans, gizmoSizePreTrans, gizmoSizePreTrans});
  ringProgram->setUniform("u_modelView", glm::value_ptr(viewMat));
  arrowProgram->setUniform("u_modelView", glm::value_ptr(viewMat));
  sphereProgram->setUniform("u_modelView", glm::value_ptr(viewMat));

  glm::mat4 projMat = view::getCameraPerspectiveMatrix();
  ringProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
  arrowProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));
  sphereProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));

  ringProgram->setUniform("u_diskWidthRel", diskWidthObj);


  render::engine->setMaterialUniforms(*arrowProgram, material);
  render::engine->setMaterialUniforms(*sphereProgram, material);

  // set selections
  glm::vec3 selectRot{0., 0., 0.};
  glm::vec3 selectTrans{0., 0., 0.};
  glm::vec3 sphereColor(0.85);
  if (selectedType == TransformHandle::Rotation) {
    selectRot[selectedDim] = 1.;
  }
  ringProgram->setUniform("u_active", selectRot);
  if (selectedType == TransformHandle::Translation) {
    selectTrans[selectedDim] = 1.;
  }
  arrowProgram->setUniform("u_active", selectTrans);
  if (selectedType == TransformHandle::Scale) {
    sphereColor = glm::vec3(0.95);
  }

  glm::mat4 P = view::getCameraPerspectiveMatrix();
  glm::mat4 Pinv = glm::inverse(P);
  arrowProgram->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  arrowProgram->setUniform("u_viewport", render::engine->getCurrentViewport());
  arrowProgram->setUniform("u_lengthMult", vecLength);
  arrowProgram->setUniform("u_radius", 0.2 * gizmoSize);

  sphereProgram->setUniform("u_invProjMatrix", glm::value_ptr(Pinv));
  sphereProgram->setUniform("u_viewport", render::engine->getCurrentViewport());

  sphereProgram->setUniform("u_pointRadius", sphereRad * gizmoSize);
  sphereProgram->setUniform("u_baseColor", sphereColor);

  render::engine->setDepthMode(DepthMode::Less);
  render::engine->setBlendMode(BlendMode::AlphaOver);
  render::engine->setBackfaceCull(false);

  // == draw

  ringProgram->draw();
  arrowProgram->draw();
  sphereProgram->draw();
}